

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

void do_xrstor_sse(CPUX86State *env,target_ulong ptr,uintptr_t ra)

{
  uint64_t uVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (ulong)(*(byte *)((long)&env->hflags + 1) >> 7) * 8 + 8;
  lVar3 = 0xa0;
  do {
    uVar1 = cpu_ldq_data_ra_x86_64(env,ptr + lVar3,ra);
    *(uint64_t *)((long)env->segs + lVar3 * 4 + -0x20) = uVar1;
    uVar1 = cpu_ldq_data_ra_x86_64(env,ptr + lVar3 + 8,ra);
    *(uint64_t *)((long)(env->segs + -1) + lVar3 * 4) = uVar1;
    lVar3 = lVar3 + 0x10;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  return;
}

Assistant:

static void do_xrstor_sse(CPUX86State *env, target_ulong ptr, uintptr_t ra)
{
    int i, nb_xmm_regs;
    target_ulong addr;

    if (env->hflags & HF_CS64_MASK) {
        nb_xmm_regs = 16;
    } else {
        nb_xmm_regs = 8;
    }

    addr = ptr + XO(legacy.xmm_regs);
    for (i = 0; i < nb_xmm_regs; i++) {
        env->xmm_regs[i].ZMM_Q(0) = cpu_ldq_data_ra(env, addr, ra);
        env->xmm_regs[i].ZMM_Q(1) = cpu_ldq_data_ra(env, addr + 8, ra);
        addr += 16;
    }
}